

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * openjtalk_getVoicePathSjis(OpenJTalk *oj,char *path)

{
  size_t sVar1;
  char *pcVar2;
  long in_RDI;
  char *res;
  char *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    if ((in_RDI != -0x210) && (sVar1 = strlen((char *)(in_RDI + 0x210)), sVar1 != 0)) {
      pcVar2 = u8tosjis_path(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      return pcVar2;
    }
    *(undefined4 *)(in_RDI + 0x678) = 0xb;
  }
  return (char *)0x0;
}

Assistant:

OPENJTALK_DLL_API char *OPENJTALK_CONVENTION openjtalk_getVoicePathSjis(OpenJTalk *oj, char *path)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (!oj->fn_voice_path || strlen(oj->fn_voice_path) == 0)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return NULL;
	}
#if defined(_WIN32)
	char *res = u8tosjis_path(oj->fn_voice_path, path);
#else
	char *res = u8tosjis_path(oj->fn_voice_path, path);
#endif
	return res;
}